

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

char * __thiscall
cmConditionEvaluator::GetDefinitionIfUnquoted
          (cmConditionEvaluator *this,cmExpandedCommandArgument *argument)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  cmake *this_00;
  PolicyID id;
  string local_1b0;
  ostringstream e;
  
  if (((WARN < this->Policy54Status) && (argument->Quoted != false)) ||
     (pcVar2 = cmMakefile::GetDefinition(this->Makefile,&argument->Value), pcVar2 == (char *)0x0)) {
    return (char *)0x0;
  }
  if (argument->Quoted != true) {
    return pcVar2;
  }
  if (this->Policy54Status != WARN) {
    return pcVar2;
  }
  bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext);
  if (bVar1) {
    return pcVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b0,(cmPolicies *)0x36,id);
  poVar3 = std::operator<<((ostream *)&e,(string *)&local_1b0);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar3 = std::operator<<((ostream *)&e,"Quoted variables like \"");
  poVar3 = std::operator<<(poVar3,(string *)argument);
  std::operator<<(poVar3,
                  "\" will no longer be dereferenced when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                 );
  this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
  std::__cxx11::stringbuf::str();
  cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1b0,&this->Backtrace,false);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return pcVar2;
}

Assistant:

const char* cmConditionEvaluator::GetDefinitionIfUnquoted(
  cmExpandedCommandArgument const& argument) const
{
  if((this->Policy54Status != cmPolicies::WARN &&
     this->Policy54Status != cmPolicies::OLD) &&
     argument.WasQuoted())
    {
    return 0;
    }

  const char* def = this->Makefile.GetDefinition(argument.GetValue());

  if(def && argument.WasQuoted() && this->Policy54Status == cmPolicies::WARN)
    {
    if(!this->Makefile.HasCMP0054AlreadyBeenReported(
         this->ExecutionContext))
      {
      std::ostringstream e;
      e << (cmPolicies::GetPolicyWarning(cmPolicies::CMP0054)) << "\n";
      e << "Quoted variables like \"" << argument.GetValue() <<
        "\" will no longer be dereferenced "
        "when the policy is set to NEW.  "
        "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()
          ->IssueMessage(cmake::AUTHOR_WARNING, e.str(),
                         this->Backtrace);
      }
    }

  return def;
}